

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O3

bool BicTest3<Blob<128>,unsigned_int>(pfHash hash,int reps,bool verbose)

{
  int *piVar1;
  void *pvVar2;
  void *__s;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined8 in_XMM7_Qb;
  uint h2;
  uint h1;
  Blob<128> key;
  uint local_90;
  uint local_8c;
  uint local_78;
  uint local_74;
  void *local_70;
  ulong local_68;
  ulong local_60;
  Rand local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_58.x = 0x88e23b73;
  local_58.y = 0x11310f6c;
  local_58.z = 0x18847f4;
  local_58.w = 0x1142a2ba;
  local_48 = 0;
  uStack_40 = 0;
  __s = operator_new(0x200000);
  lVar12 = 0;
  memset(__s,0,0x200000);
  lVar5 = (long)__s + 0x10;
  do {
    if ((byte)((byte)((char)lVar12 * -0x55) >> 2 | (char)lVar12 * -0x40) < 0x16) {
      putchar(0x2e);
    }
    if (0 < reps) {
      iVar14 = 0;
      do {
        Rand::rand_p(&local_58,&local_48,0x10);
        (*hash)(&local_48,0x10,0,&local_74);
        flipbit(&local_48,0x10,(uint32_t)lVar12);
        (*hash)(&local_48,0x10,0,&local_78);
        lVar3 = -0x1f;
        lVar8 = 0;
        lVar4 = lVar5;
        do {
          uVar7 = (uint)lVar8;
          lVar8 = lVar8 + 1;
          lVar9 = lVar3;
          lVar10 = lVar4;
          do {
            piVar1 = (int *)(lVar10 + (ulong)(((local_78 ^ local_74) >> (uVar7 & 0x1f) & 1) +
                                             ((local_78 ^ local_74) >> ((uint)lVar9 & 0x1f) & 1) * 2
                                             ) * 4);
            *piVar1 = *piVar1 + 1;
            lVar10 = lVar10 + 0x10;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0);
          lVar4 = lVar4 + 0x210;
          lVar3 = lVar3 + 1;
        } while (lVar8 != 0x1f);
        iVar14 = iVar14 + 1;
      } while (iVar14 != reps);
    }
    lVar12 = lVar12 + 1;
    lVar5 = lVar5 + 0x4000;
  } while (lVar12 != 0x80);
  putchar(10);
  auVar21 = ZEXT1664(ZEXT816(0x4000000000000000));
  auVar22 = ZEXT1664(ZEXT816(0xbff0000000000000));
  auVar23 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  uVar15 = 1;
  uVar13 = 0;
  local_90 = 0;
  local_8c = 0;
  auVar17 = ZEXT864(0) << 0x40;
  uVar6 = 0;
  local_70 = __s;
LAB_0011ba4c:
  local_68 = uVar6 + 1;
  local_60 = uVar15;
LAB_0011ba5a:
  if (verbose) {
    printf("(%3d,%3d) - ",uVar6 & 0xffffffff,uVar15 & 0xffffffff);
    auVar23 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    auVar22 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar21 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar17 = ZEXT864(auVar17._0_8_);
  }
  pvVar2 = local_70;
  uVar11 = 0;
LAB_0011baa9:
  do {
    auVar20 = ZEXT864(0) << 0x40;
    lVar5 = 0;
    do {
      lVar12 = lVar5 * 4;
      lVar5 = lVar5 + 1;
      auVar18._0_8_ =
           (double)*(int *)((long)pvVar2 + lVar12 + uVar11 * 0x4000 + uVar15 * 0x10) /
           (double)(reps / 2);
      auVar18._8_8_ = in_XMM7_Qb;
      auVar18 = vfmadd213sd_fma(auVar18,auVar21._0_16_,auVar22._0_16_);
      auVar18 = vandpd_avx(auVar18,auVar23._0_16_);
      auVar18 = vmaxsd_avx(auVar18,auVar20._0_16_);
      auVar20 = ZEXT1664(auVar18);
    } while (lVar5 != 4);
    dVar19 = auVar18._0_8_;
    if (auVar17._0_8_ < dVar19) {
      uVar13 = uVar11 & 0xffffffff;
      auVar17 = ZEXT1664(auVar18);
      local_90 = (uint)uVar6;
      local_8c = (uint)uVar15;
    }
    if (!verbose) goto LAB_0011bb6d;
    iVar14 = 0x2e;
    uVar16 = auVar17._0_8_;
    if ((0.01 <= dVar19) && (iVar14 = 0x6f, 0.05 <= dVar19)) {
      iVar14 = (uint)(0.33 <= dVar19) * 9 + 0x4f;
    }
    putchar(iVar14);
    auVar17 = ZEXT864(uVar16);
    auVar21 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar22 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar23 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x80);
  if (verbose) {
    putchar(10);
    auVar23 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    auVar22 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar21 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar17 = ZEXT864(uVar16);
    uVar15 = uVar15 + 1;
    if (uVar15 == 0x20) {
      iVar14 = 0x8c;
      do {
        putchar(0x2d);
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
      putchar(10);
      auVar17 = ZEXT864(uVar16);
      auVar21 = ZEXT1664(ZEXT816(0x4000000000000000));
      auVar22 = ZEXT1664(ZEXT816(0xbff0000000000000));
      auVar23 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
      goto LAB_0011bc0f;
    }
    goto LAB_0011ba5a;
  }
  goto LAB_0011bbc0;
LAB_0011bb6d:
  uVar11 = uVar11 + 1;
  if (uVar11 == 0x80) goto LAB_0011bbc0;
  goto LAB_0011baa9;
LAB_0011bbc0:
  uVar15 = uVar15 + 1;
  if (uVar15 == 0x20) goto LAB_0011bc0f;
  goto LAB_0011ba5a;
LAB_0011bc0f:
  local_70 = (void *)((long)local_70 + 0x200);
  uVar15 = local_60 + 1;
  uVar6 = local_68;
  if (local_68 == 0x1f) {
    printf("Max bias %f - (%3d : %3d,%3d)\n",uVar13,(ulong)local_90,(ulong)local_8c);
    operator_delete(__s);
    return auVar17._0_8_ < 0.05;
  }
  goto LAB_0011ba4c;
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}